

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_two_connections.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_2bcd1c::TwoConnections::TwoConnections(TwoConnections *this)

{
  undefined1 local_40 [48];
  TwoConnections *local_10;
  TwoConnections *this_local;
  
  local_10 = this;
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TwoConnections_003d56f0;
  db_file::db_file(&this->file);
  db_file::file((db_file *)(local_40 + 0x10));
  pstore::database::database<pstore::file::in_memory>
            (&this->first,(shared_ptr<pstore::file::in_memory> *)(local_40 + 0x10),true);
  std::shared_ptr<pstore::file::in_memory>::~shared_ptr
            ((shared_ptr<pstore::file::in_memory> *)(local_40 + 0x10));
  db_file::file((db_file *)local_40);
  pstore::database::database<pstore::file::in_memory>
            (&this->second,(shared_ptr<pstore::file::in_memory> *)local_40,true);
  std::shared_ptr<pstore::file::in_memory>::~shared_ptr
            ((shared_ptr<pstore::file::in_memory> *)local_40);
  pstore::database::set_vacuum_mode(&this->first,disabled);
  pstore::database::set_vacuum_mode(&this->second,disabled);
  return;
}

Assistant:

TwoConnections ()
                : file ()
                , first (file.file ())
                , second (file.file ()) {

            first.set_vacuum_mode (pstore::database::vacuum_mode::disabled);
            second.set_vacuum_mode (pstore::database::vacuum_mode::disabled);
        }